

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O3

void zmInvMont2(word *b,word *a,qr_o *r,void *stack)

{
  void *pvVar1;
  size_t sVar2;
  
  pvVar1 = r->params;
  for (sVar2 = zzAlmostInvMod(b,a,r->mod,r->n,stack);
      sVar2 < (ulong)(*(long *)((long)pvVar1 + 8) * 2); sVar2 = sVar2 + 1) {
    zzDoubleMod(b,b,r->mod,r->n);
  }
  return;
}

Assistant:

static void zmInvMont2(word b[], const word a[], const qr_o* r, void* stack)
{
	register size_t k;
	const zm_mont_params_st* params;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	params = (const zm_mont_params_st*)r->params;
	// b <- a^{-1} 2^k \mod mod
	k = zzAlmostInvMod(b, a, r->mod, r->n, stack);
	ASSERT(wwBitSize(r->mod, r->n) <= k);
	ASSERT(k <= 2 * wwBitSize(r->mod, r->n));
	// b <- a^{-1} R^2 \mod mod
	for (; k < 2 * params->l; ++k)
		zzDoubleMod(b, b, r->mod, r->n);
}